

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void charevnt_breakfast_vischar(tgestate_t *state,route_t *route)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  
  bVar2 = state->IY->character;
  if (bVar2 != 0) {
    route->step = '\0';
    bVar3 = bVar2 & 1 | 0x18;
    if (0x13 < bVar2) {
      bVar3 = bVar2 - 2;
    }
    route->index = bVar3;
    return;
  }
  if (state->in_solitary != '\0') {
    return;
  }
  puVar1 = &state->vischars[0].flags;
  *puVar1 = *puVar1 & 0xbf;
  state->vischars[0].route.index = '+';
  state->vischars[0].route.step = '\0';
  set_route(state,state->vischars);
  return;
}

Assistant:

void charevnt_breakfast_vischar(tgestate_t *state, route_t *route)
{
  character_t character;
  vischar_t  *vischar;

  assert(state != NULL);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  vischar = state->IY;
  ASSERT_VISCHAR_VALID(vischar);

  character = vischar->character;
  if (character == character_0_COMMANDANT)
  {
    static const route_t t = { routeindex_43_7833, 0 }; /* was BC */
    set_hero_route(state, &t);
  }
  else
  {
    charevnt_breakfast_common(state, character, route); /* was fallthrough */
  }
}